

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop.cpp
# Opt level: O2

void __thiscall so_5::coop_t::~coop_t(coop_t *this)

{
  this->_vptr_coop_t = (_func_int **)&PTR__coop_t_002c72b8;
  std::
  vector<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
  ::clear(&this->m_agent_array);
  delete_user_resources(this);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->m_resource_deleters);
  intrusive_ptr_t<so_5::coop_dereg_notificators_container_t>::dismiss_object
            (&this->m_dereg_notificators);
  intrusive_ptr_t<so_5::coop_reg_notificators_container_t>::dismiss_object
            (&this->m_reg_notificators);
  std::__cxx11::string::~string((string *)&this->m_parent_coop_name);
  std::
  vector<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
  ::~vector(&this->m_agent_array);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_coop_disp_binder).
              super___shared_ptr<so_5::disp_binder_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&this->m_coop_name);
  return;
}

Assistant:

coop_t::~coop_t()
{
	// Initiate deleting of agents by hand to guarantee that
	// agents will be destroyed before return from coop_t
	// destructor.
	//
	// NOTE: because agents are stored here by smart references
	// for some agents this operation will lead only to reference
	// counter descrement. Not to deletion of agent.
	m_agent_array.clear();

	// Now all user resources should be destroyed.
	delete_user_resources();
}